

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDF_objects.cc
# Opt level: O0

QPDFObjectHandle __thiscall QPDF::makeIndirectFromQPDFObject(QPDF *this,shared_ptr<QPDFObject> *obj)

{
  QPDFObjGen obj_00;
  pointer pMVar1;
  mapped_type *this_00;
  QPDFObjGen in_RDX;
  QPDFObjectHandle QVar2;
  shared_ptr<QPDFObject> local_58;
  ObjCache local_48;
  QPDFObjGen local_28;
  QPDFObjGen next;
  shared_ptr<QPDFObject> *obj_local;
  QPDF *this_local;
  
  next = in_RDX;
  local_28 = nextObjGen((QPDF *)obj);
  std::shared_ptr<QPDFObject>::shared_ptr(&local_58,(shared_ptr<QPDFObject> *)next);
  ObjCache::ObjCache(&local_48,&local_58,-1,-1);
  pMVar1 = std::unique_ptr<QPDF::Members,_std::default_delete<QPDF::Members>_>::operator->
                     ((unique_ptr<QPDF::Members,_std::default_delete<QPDF::Members>_> *)obj);
  this_00 = std::
            map<QPDFObjGen,_QPDF::ObjCache,_std::less<QPDFObjGen>,_std::allocator<std::pair<const_QPDFObjGen,_QPDF::ObjCache>_>_>
            ::operator[](&pMVar1->obj_cache,&local_28);
  ObjCache::operator=(this_00,&local_48);
  ObjCache::~ObjCache(&local_48);
  std::shared_ptr<QPDFObject>::~shared_ptr(&local_58);
  obj_00 = local_28;
  pMVar1 = std::unique_ptr<QPDF::Members,_std::default_delete<QPDF::Members>_>::operator->
                     ((unique_ptr<QPDF::Members,_std::default_delete<QPDF::Members>_> *)obj);
  std::
  map<QPDFObjGen,_QPDF::ObjCache,_std::less<QPDFObjGen>,_std::allocator<std::pair<const_QPDFObjGen,_QPDF::ObjCache>_>_>
  ::operator[](&pMVar1->obj_cache,&local_28);
  QVar2 = newIndirect(this,(QPDFObjGen)obj,(shared_ptr<QPDFObject> *)obj_00);
  QVar2.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (QPDFObjectHandle)
         QVar2.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

QPDFObjectHandle
QPDF::makeIndirectFromQPDFObject(std::shared_ptr<QPDFObject> const& obj)
{
    QPDFObjGen next{nextObjGen()};
    m->obj_cache[next] = ObjCache(obj, -1, -1);
    return newIndirect(next, m->obj_cache[next].object);
}